

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFileLock(unixFile *pFile,flock *pLock)

{
  ushort uVar1;
  unixInodeInfo *puVar2;
  int iVar3;
  flock lock;
  
  puVar2 = pFile->pInode;
  uVar1 = pFile->ctrlFlags;
  if ((uVar1 & 1) == 0) {
    if (((uVar1 & 2) != 0) || (puVar2->bProcessLock == '\0')) {
LAB_00157e1c:
      iVar3 = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6,pLock,aSyscall[7].pCurrent);
      return iVar3;
    }
  }
  else if ((uVar1 & 2) != 0) goto LAB_00157e1c;
  iVar3 = 0;
  if (puVar2->bProcessLock == '\0') {
    iVar3 = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6);
    if (-1 < iVar3) {
      puVar2->bProcessLock = '\x01';
      puVar2->nLock = puVar2->nLock + 1;
    }
  }
  return iVar3;
}

Assistant:

static int unixFileLock(unixFile *pFile, struct flock *pLock){
  int rc;
  unixInodeInfo *pInode = pFile->pInode;
  assert( unixMutexHeld() );
  assert( pInode!=0 );
  if( ((pFile->ctrlFlags & UNIXFILE_EXCL)!=0 || pInode->bProcessLock)
   && ((pFile->ctrlFlags & UNIXFILE_RDONLY)==0)
  ){
    if( pInode->bProcessLock==0 ){
      struct flock lock;
      assert( pInode->nLock==0 );
      lock.l_whence = SEEK_SET;
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
      lock.l_type = F_WRLCK;
      rc = osFcntl(pFile->h, F_SETLK, &lock);
      if( rc<0 ) return rc;
      pInode->bProcessLock = 1;
      pInode->nLock++;
    }else{
      rc = 0;
    }
  }else{
    rc = osFcntl(pFile->h, F_SETLK, pLock);
  }
  return rc;
}